

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void copy_mbmi_ext_frame_to_mbmi_ext
               (MB_MODE_INFO_EXT *mbmi_ext,MB_MODE_INFO_EXT_FRAME *mbmi_ext_best,
               uint8_t ref_frame_type)

{
  CANDIDATE_MV *pCVar1;
  uint8_t ref_frame_type_local;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best_local;
  MB_MODE_INFO_EXT *mbmi_ext_local;
  
  pCVar1 = mbmi_ext->ref_mv_stack[ref_frame_type];
  *pCVar1 = mbmi_ext_best->ref_mv_stack[0];
  pCVar1[1] = mbmi_ext_best->ref_mv_stack[1];
  pCVar1[2] = mbmi_ext_best->ref_mv_stack[2];
  pCVar1[3] = mbmi_ext_best->ref_mv_stack[3];
  mbmi_ext->weight[ref_frame_type] = *&mbmi_ext_best->weight;
  mbmi_ext->mode_context[ref_frame_type] = mbmi_ext_best->mode_context;
  mbmi_ext->ref_mv_count[ref_frame_type] = mbmi_ext_best->ref_mv_count;
  *(undefined8 *)mbmi_ext->global_mvs = *(undefined8 *)mbmi_ext_best->global_mvs;
  *(undefined8 *)(mbmi_ext->global_mvs + 2) = *(undefined8 *)(mbmi_ext_best->global_mvs + 2);
  *(undefined8 *)(mbmi_ext->global_mvs + 4) = *(undefined8 *)(mbmi_ext_best->global_mvs + 4);
  *(undefined8 *)(mbmi_ext->global_mvs + 6) = *(undefined8 *)(mbmi_ext_best->global_mvs + 6);
  return;
}

Assistant:

static inline void copy_mbmi_ext_frame_to_mbmi_ext(
    MB_MODE_INFO_EXT *mbmi_ext,
    const MB_MODE_INFO_EXT_FRAME *const mbmi_ext_best, uint8_t ref_frame_type) {
  memcpy(mbmi_ext->ref_mv_stack[ref_frame_type], mbmi_ext_best->ref_mv_stack,
         sizeof(mbmi_ext->ref_mv_stack[USABLE_REF_MV_STACK_SIZE]));
  memcpy(mbmi_ext->weight[ref_frame_type], mbmi_ext_best->weight,
         sizeof(mbmi_ext->weight[USABLE_REF_MV_STACK_SIZE]));
  mbmi_ext->mode_context[ref_frame_type] = mbmi_ext_best->mode_context;
  mbmi_ext->ref_mv_count[ref_frame_type] = mbmi_ext_best->ref_mv_count;
  memcpy(mbmi_ext->global_mvs, mbmi_ext_best->global_mvs,
         sizeof(mbmi_ext->global_mvs));
}